

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

int luv_fs_write(lua_State *L)

{
  int iVar1;
  int iVar2;
  lua_Integer lVar3;
  uv_buf_t *puVar4;
  lua_Integer off;
  uv_fs_t *req;
  luv_req_t *plVar5;
  uv_loop_t *loop;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  uv_buf_t *bufs;
  size_t *count;
  code *cb;
  uint nbufs;
  uv_buf_t buf;
  uint local_38 [2];
  
  nbufs = 1;
  lVar3 = luaL_checkinteger(L,1);
  iVar1 = lua_type(L,2);
  if (iVar1 == 5) {
    puVar4 = luv_prep_bufs(L,(int)local_38,count);
    buf.base = (char *)0x0;
    nbufs = local_38[0];
  }
  else {
    iVar1 = lua_isstring(L,2);
    if (iVar1 == 0) {
      iVar1 = luaL_argerror(L,2,"data must be string or table of strings");
      return iVar1;
    }
    luv_check_buf(L,2,&buf);
    puVar4 = (uv_buf_t *)0x0;
  }
  pcVar8 = buf.base;
  off = luaL_checkinteger(L,3);
  iVar1 = luv_check_continuation(L,4);
  req = (uv_fs_t *)lua_newuserdata(L,0x1b8);
  plVar5 = luv_setup_req(L,iVar1);
  req->data = plVar5;
  req->ptr = pcVar8;
  plVar5->data = puVar4;
  iVar1 = plVar5->callback_ref;
  loop = luv_loop(L);
  bufs = &buf;
  if (puVar4 != (uv_buf_t *)0x0) {
    bufs = puVar4;
  }
  cb = (uv_fs_cb)0x0;
  if (iVar1 != -2) {
    cb = luv_fs_cb;
  }
  iVar2 = uv_fs_write(loop,req,(uv_file)lVar3,bufs,nbufs,off,cb);
  if ((req->fs_type == UV_FS_ACCESS) || (-1 < iVar2)) {
    if (iVar1 != -2) {
      lua_rawgeti(L,-0xf4628,(long)plVar5->req_ref);
      return 1;
    }
    iVar1 = push_fs_result(L,req);
    if (req->fs_type == UV_FS_SCANDIR) {
      return iVar1;
    }
  }
  else {
    lua_pushnil(L);
    pcVar8 = req->path;
    pcVar6 = uv_err_name((int)req->result);
    pcVar7 = uv_strerror((int)req->result);
    if (pcVar8 == (char *)0x0) {
      lua_pushfstring(L,"%s: %s",pcVar6,pcVar7);
    }
    else {
      lua_pushfstring(L,"%s: %s: %s",pcVar6,pcVar7,req->path);
    }
    iVar1 = 3;
    pcVar8 = uv_err_name((int)req->result);
    lua_pushstring(L,pcVar8);
  }
  luv_cleanup_req(L,(luv_req_t *)req->data);
  req->data = (void *)0x0;
  uv_fs_req_cleanup(req);
  return iVar1;
}

Assistant:

static int luv_fs_write(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  uv_file file = luaL_checkinteger(L, 1);
  int64_t offset = luaL_checkinteger(L, 3);
  int ref = luv_check_continuation(L, 4);
  uv_fs_t* req = (uv_fs_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);
  size_t count;
  uv_buf_t* bufs = luv_check_bufs(L, 2, &count, (luv_req_t*)req->data);
  int nargs;
  FS_CALL_NORETURN(write, req, file, bufs, count, offset);
  free(bufs);
  return nargs;
}